

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O2

void __thiscall
slang::ast::MethodBuilder::MethodBuilder
          (MethodBuilder *this,Compilation *compilation,string_view name,Type *returnType,
          SubroutineKind kind)

{
  SubroutineSymbol *pSVar1;
  VariableLifetime local_28;
  SubroutineKind local_24;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = name._M_str;
  local_20._M_len = name._M_len;
  this->compilation = compilation;
  local_28 = Automatic;
  local_24 = kind;
  pSVar1 = BumpAllocator::
           emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::VariableLifetime,slang::ast::SubroutineKind&>
                     (&compilation->super_BumpAllocator,compilation,&local_20,
                      (SourceLocation *)&SourceLocation::NoLocation,&local_28,&local_24);
  this->symbol = pSVar1;
  (this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.data_ =
       (pointer)(this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.
                firstElement;
  (this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len = 0;
  (this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.cap = 5;
  (pSVar1->declaredReturnType).type = returnType;
  (pSVar1->flags).m_bits = 0x200;
  return;
}

Assistant:

MethodBuilder::MethodBuilder(Compilation& compilation, std::string_view name,
                             const Type& returnType, SubroutineKind kind) :
    compilation(compilation),
    symbol(*compilation.emplace<SubroutineSymbol>(compilation, name, NL,
                                                  VariableLifetime::Automatic, kind)) {
    symbol.declaredReturnType.setType(returnType);
    symbol.flags = MethodFlags::BuiltIn;
}